

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O0

int Npn_TruthSuppSize(word t,int nVars)

{
  int iVar1;
  int local_1c;
  int local_18;
  int nSupp;
  int v;
  int nVars_local;
  word t_local;
  
  local_1c = 0;
  if (nVars < 7) {
    for (local_18 = 0; local_18 < nVars; local_18 = local_18 + 1) {
      iVar1 = Npn_TruthHasVar(t,local_18);
      if (iVar1 != 0) {
        local_1c = local_1c + 1;
      }
    }
    return local_1c;
  }
  __assert_fail("nVars <= 6",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpnSave.c"
                ,0x9c,"int Npn_TruthSuppSize(word, int)");
}

Assistant:

static inline int Npn_TruthSuppSize( word t, int nVars )
{
    int v, nSupp = 0;
    assert( nVars <= 6 );
    for ( v = 0; v < nVars; v++ )
        if ( Npn_TruthHasVar( t, v ) )
            nSupp++;
    return nSupp;
}